

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neldermead.c
# Opt level: O2

int nel_min(custom_function *funcpt,double *xc,int N,double *dx,double fsval,int MAXITER,int *niter,
           double eps,double *xf)

{
  size_t __size;
  bool bVar1;
  uint uVar2;
  double *__ptr;
  double *__ptr_00;
  void *__ptr_01;
  double *__ptr_02;
  double *__ptr_03;
  double *__ptr_04;
  void *__ptr_05;
  double *__ptr_06;
  double *__ptr_07;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int local_b8;
  double local_b0;
  double local_a8;
  uint local_3c;
  
  uVar2 = N + 1;
  *niter = 0;
  lVar14 = (long)N;
  __size = lVar14 * 8;
  __ptr = (double *)malloc(__size * (long)(int)uVar2);
  __ptr_00 = (double *)malloc((long)(int)uVar2 << 3);
  __ptr_01 = malloc(__size);
  __ptr_02 = (double *)malloc(__size);
  __ptr_03 = (double *)malloc(__size);
  __ptr_04 = (double *)malloc(__size);
  __ptr_05 = malloc(__size);
  __ptr_06 = (double *)malloc(__size);
  __ptr_07 = (double *)malloc(__size);
  uVar3 = 0;
  uVar7 = 0;
  if (0 < N) {
    uVar7 = (ulong)(uint)N;
  }
  for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    __ptr_06[uVar3] = xc[uVar3];
  }
  lVar8 = -uVar7;
  bVar16 = true;
  local_b0 = 1.0;
  local_a8 = 1.0;
  local_3c = N * N;
LAB_0013e9a0:
  do {
    if ((!bVar16) || (MAXITER <= *niter)) {
      for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
        xf[uVar3] = __ptr[(uint)(N * N) + uVar3];
      }
      iVar10 = *niter;
      free(__ptr_00);
      free(__ptr);
      free(__ptr_01);
      free(__ptr_02);
      free(__ptr_03);
      free(__ptr_04);
      free(__ptr_05);
      free(__ptr_06);
      free(__ptr_07);
      return (uint)(MAXITER <= iVar10) * 3 + 1;
    }
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      __ptr[(long)(int)local_3c + uVar3] = __ptr_06[uVar3];
    }
    dVar17 = (*funcpt->funcpt)(__ptr_06,N,funcpt->params);
    __ptr_00[lVar14] = dVar17;
    pdVar5 = __ptr;
    for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
      __ptr_06[uVar3] = dx[uVar3] * local_b0 + __ptr_06[uVar3];
      for (uVar4 = 0; (uint)N != uVar4; uVar4 = uVar4 + 1) {
        pdVar5[uVar4] = __ptr_06[uVar4];
      }
      dVar17 = (*funcpt->funcpt)(__ptr_06,N,funcpt->params);
      __ptr_00[uVar3] = dVar17;
      __ptr_06[uVar3] = __ptr_06[uVar3] - dx[uVar3] * local_b0;
      pdVar5 = pdVar5 + lVar14;
    }
    dVar17 = *__ptr_00;
    uVar4 = 0;
    for (uVar3 = 1; lVar8 + uVar3 != 1; uVar3 = uVar3 + 1) {
      if (__ptr_00[uVar3] < dVar17) {
        uVar4 = uVar3 & 0xffffffff;
        dVar17 = __ptr_00[uVar3];
      }
    }
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      *(double *)((long)__ptr_05 + uVar3 * 8) = __ptr[(long)((int)uVar4 * N) + uVar3];
    }
    bVar1 = false;
    while ((eps < ABS(local_a8) && (*niter < MAXITER))) {
      *niter = *niter + 1;
      dVar18 = *__ptr_00;
      uVar12 = 0;
      for (uVar3 = 1; lVar8 + uVar3 != 1; uVar3 = uVar3 + 1) {
        if (dVar18 < __ptr_00[uVar3]) {
          uVar12 = uVar3 & 0xffffffff;
          dVar18 = __ptr_00[uVar3];
        }
      }
      iVar10 = (int)uVar12;
      iVar11 = iVar10 * N;
      pdVar5 = __ptr;
      for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
        dVar18 = 0.0;
        pdVar9 = pdVar5;
        uVar13 = (ulong)uVar2;
        while (bVar16 = uVar13 != 0, uVar13 = uVar13 - 1, bVar16) {
          dVar18 = dVar18 + *pdVar9;
          pdVar9 = pdVar9 + lVar14;
        }
        *(double *)((long)__ptr_01 + uVar3 * 8) = (dVar18 - __ptr[(long)iVar11 + uVar3]) / (double)N
        ;
        pdVar5 = pdVar5 + 1;
      }
      for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
        dVar18 = *(double *)((long)__ptr_01 + uVar3 * 8);
        __ptr_02[uVar3] = (dVar18 + dVar18) - __ptr[(long)iVar11 + uVar3];
      }
      dVar18 = (*funcpt->funcpt)(__ptr_02,N,funcpt->params);
      if (dVar17 <= dVar18) {
        uVar15 = 0;
        for (lVar6 = 0; lVar6 <= lVar14; lVar6 = lVar6 + 1) {
          uVar15 = uVar15 + (dVar18 < __ptr_00[lVar6]);
        }
        local_b8 = iVar11;
        if (uVar15 == 0) {
          for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
            __ptr_03[uVar3] =
                 __ptr[(long)iVar11 + uVar3] * 0.5 + *(double *)((long)__ptr_01 + uVar3 * 8) * 0.5;
          }
          dVar19 = (*funcpt->funcpt)(__ptr_03,N,funcpt->params);
          if (dVar19 <= __ptr_00[iVar10]) {
            for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
              __ptr[(long)iVar11 + uVar3] = __ptr_03[uVar3];
            }
            __ptr_00[iVar10] = dVar19;
          }
          else {
            pdVar5 = __ptr;
            for (lVar6 = 0; lVar6 <= lVar14; lVar6 = lVar6 + 1) {
              for (uVar3 = 0; (uint)N != uVar3; uVar3 = uVar3 + 1) {
                dVar17 = (pdVar5[uVar3] + *(double *)((long)__ptr_05 + uVar3 * 8)) * 0.5;
                pdVar5[uVar3] = dVar17;
                __ptr_04[uVar3] = dVar17;
              }
              dVar17 = (*funcpt->funcpt)(__ptr_04,N,funcpt->params);
              __ptr_00[lVar6] = dVar17;
              pdVar5 = pdVar5 + lVar14;
            }
            dVar17 = *__ptr_00;
            uVar4 = 0;
            for (uVar3 = 1; lVar8 + uVar3 != 1; uVar3 = uVar3 + 1) {
              if (__ptr_00[uVar3] < dVar17) {
                uVar4 = uVar3 & 0xffffffff;
                dVar17 = __ptr_00[uVar3];
              }
            }
            local_b8 = (int)uVar4 * N;
            for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
              *(double *)((long)__ptr_05 + uVar3 * 8) = __ptr[(long)local_b8 + uVar3];
            }
          }
        }
        if (uVar15 == 1) {
          for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
            __ptr_03[uVar3] =
                 __ptr[(long)local_b8 + uVar3] * 0.5 + *(double *)((long)__ptr_01 + uVar3 * 8) * 0.5
            ;
          }
          dVar19 = (*funcpt->funcpt)(__ptr_03,N,funcpt->params);
          uVar3 = 0;
          if (dVar19 <= dVar18) {
            for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
              __ptr[(long)iVar11 + uVar3] = __ptr_03[uVar3];
            }
          }
          else {
            for (; dVar19 = dVar18, uVar7 != uVar3; uVar3 = uVar3 + 1) {
              __ptr[(long)iVar11 + uVar3] = __ptr_02[uVar3];
            }
          }
          __ptr_00[iVar10] = dVar19;
        }
        if (uVar15 < 2) {
          dVar18 = __ptr_00[iVar10];
        }
        else {
          for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
            __ptr[(long)iVar11 + uVar3] = __ptr_02[uVar3];
          }
          __ptr_00[iVar10] = dVar18;
        }
      }
      else {
        for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
          __ptr_03[uVar3] =
               (__ptr_02[uVar3] + __ptr_02[uVar3]) - *(double *)((long)__ptr_01 + uVar3 * 8);
        }
        dVar19 = (*funcpt->funcpt)(__ptr_03,N,funcpt->params);
        uVar3 = 0;
        if (dVar18 <= dVar19) {
          for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
            __ptr[(long)iVar11 + uVar3] = __ptr_02[uVar3];
          }
          __ptr_00[iVar10] = dVar18;
        }
        else {
          for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
            __ptr[(long)iVar11 + uVar3] = __ptr_03[uVar3];
          }
          __ptr_00[iVar10] = dVar19;
          dVar18 = dVar19;
        }
      }
      dVar19 = dVar18;
      if (dVar17 <= dVar18) {
        dVar19 = dVar17;
      }
      dVar20 = 0.0;
      for (lVar6 = 0; lVar6 <= lVar14; lVar6 = lVar6 + 1) {
        dVar20 = dVar20 + __ptr_00[lVar6];
      }
      local_a8 = 0.0;
      for (lVar6 = 0; lVar6 <= lVar14; lVar6 = lVar6 + 1) {
        dVar21 = __ptr_00[lVar6] - dVar20 / (double)(int)uVar2;
        local_a8 = local_a8 + dVar21 * dVar21;
      }
      if (dVar18 < dVar17) {
        uVar4 = uVar12;
      }
      if (local_a8 < 0.0) {
        local_a8 = sqrt(local_a8);
      }
      else {
        local_a8 = SQRT(local_a8);
      }
      dVar17 = dVar19;
      if (ABS(local_a8) < eps) {
        bVar1 = true;
      }
    }
    local_3c = (int)uVar4 * N;
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      __ptr_07[uVar3] = __ptr[(long)(int)local_3c + uVar3];
    }
    dVar17 = __ptr_00[(int)uVar4];
    uVar3 = 0;
    do {
      if (uVar7 == uVar3) {
        bVar16 = false;
        if (bVar1 || (uVar7 & 0x7fffffff) != 0) goto LAB_0013e9a0;
        break;
      }
      local_b0 = dx[uVar3] * 0.001;
      __ptr_07[uVar3] = __ptr_07[uVar3] + local_b0;
      dVar18 = (*funcpt->funcpt)(__ptr_07,N,funcpt->params);
      if (dVar18 < dVar17) break;
      __ptr_07[uVar3] = __ptr_07[uVar3] - (local_b0 + local_b0);
      dVar18 = (*funcpt->funcpt)(__ptr_07,N,funcpt->params);
      uVar3 = uVar3 + 1;
    } while (dVar17 <= dVar18);
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      __ptr_06[uVar3] = __ptr_07[uVar3];
    }
    local_b0 = 0.001;
    bVar16 = true;
    local_a8 = 1.0;
  } while( true );
}

Assistant:

int nel_min(custom_function *funcpt,double *xc,int N,double *dx,double fsval,int MAXITER,int *niter,
		double eps,double *xf) {
	int rcode,NN,i,j,ct,ctl;
	int ihi,ilo,L,siter;
	double reqmin,rcoeff,ecoeff,ccoeff,fn,del;
	double ylo,ynl,temp,ys,yss;
	double *P,*Y,*PB,*PS,*PSS,*PM,*PL,*xi,*xmin;
	double ysum,yavg,s,dval;

	rcode = 0;
	reqmin = eps;
	rcoeff = 1.0;
	ecoeff = 2.0;
	ccoeff = 0.5;
	del = 1.0;
	NN = N + 1;
	ct = N * N;
	*niter = 0;
	siter = MAXITER;
	s = 1.0;
	ctl = 0;
	dval = 1.0e-03;

	P = (double*) malloc(sizeof(double) * N * NN);
	Y = (double*) malloc(sizeof(double) * NN);
	PB = (double*) malloc(sizeof(double) * N);
	PS = (double*) malloc(sizeof(double) * N);
	PSS = (double*) malloc(sizeof(double) * N);
	PM = (double*) malloc(sizeof(double) * N);
	PL = (double*) malloc(sizeof(double) * N);
	xi = (double*) malloc(sizeof(double) * N);
	xmin = (double*) malloc(sizeof(double) * N);

	for (i = 0; i < N;++i) {
		xi[i] = xc[i];
	}

	while (ctl == 0 && *niter < siter) {
		// Create N+1 point Simplex
		for (i = 0; i < N;++i) {
			P[ct + i] = xi[i];
		}

		fn = FUNCPT_EVAL(funcpt,xi,N);
		Y[N] = fn;


		for (i = 0; i < N;++i) {
			xi[i] += dx[i] * del;
			ct = i * N;
			for (j = 0; j < N;++j) {
				P[ct + j] = xi[j];
			}
			fn = FUNCPT_EVAL(funcpt, xi, N);
			Y[i] = fn;
			xi[i] -= dx[i] * del;
		}

		ylo = Y[0];
		ilo = 0;

		for (i = 1; i < NN;++i) {

			if (Y[i] < ylo) {
				ylo = Y[i];
				ilo = i;
			}
		}

		ct = ilo * N;

		for (i = 0; i < N;++i) {
			PL[i] = P[ct + i];
		}


		while (fabs(s) > reqmin && *niter < siter) {
			*niter = *niter + 1;

			// Find highest and lowest function values.

			ynl = Y[0];
			ihi = 0;

			for (i = 1; i < NN;++i) {

				if (Y[i] > ynl) {
					ynl = Y[i];
					ihi = i;
				}

			}


			// Find PB [Centroid]
			ct = N;
			for(i = 0; i < N;i++) {
				temp = 0.0;
				for ( j = 0; j < NN;++j) {
					temp += P[j*ct+i];
				}
				temp -= P[ihi*ct+i];
				PB[i] = temp / (double) N;
			}

			// Find reflection
			ct = ihi * N;
			for (i = 0; i < N;++i) {
				PS[i] = (1.0 + rcoeff) * PB[i] - rcoeff * P[ct+i];
			}
			ys = FUNCPT_EVAL(funcpt, PS, N);

			if (ys < ylo) {
				for (i = 0; i < N;++i) {
					PSS[i] = ecoeff * PS[i] + (1.0 - ecoeff) * PB[i];
				}
				yss = FUNCPT_EVAL(funcpt, PSS, N);

				if (yss < ys) {
					for(i = 0; i < N;++i) {
						P[ct + i] = PSS[i];
					}
					Y[ihi] = yss;
				} else {
					for(i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;
				}


			} else {
				L = 0;
				for (i = 0; i < NN;++i) {
					if (Y[i] > ys) {
						L++;
					}
				}
	/*
				if (L == 1) {
					for ( i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;
				}*/
				if (L == 0) {
					for (i = 0; i < N;++i) {
						PSS[i] = ccoeff * P[ct + i] + (1.0 - ccoeff) * PB[i];
					}
					yss = FUNCPT_EVAL(funcpt, PSS, N);

					if (yss <= Y[ihi]) {
						for(i = 0; i < N;++i) {
							P[ct + i] = PSS[i];
						}
						Y[ihi] = yss;

					} else {

						//ctl = ilo * N;
						for(i = 0; i < NN;++i) {
							ct = i * N;
							for (j = 0;j < N;++j) {
								P[ct + j] = 0.5 * (P[ct + j] + PL[j]);
								PM[j] = P[ct + j];
							}
							Y[i] = FUNCPT_EVAL(funcpt, PM, N);

						}
						ylo = Y[0];
						ilo = 0;

						for (i = 1; i < NN;++i) {

							if (Y[i] < ylo) {
								ylo = Y[i];
								ilo = i;
							}

						}
						ct = ilo * N;

						for (i = 0; i < N;++i) {
							PL[i] = P[ct + i];
						}
					}
				}
				if (L == 1) {
					for (i = 0; i < N;++i) {
						PSS[i] = ccoeff * P[ct + i] + (1.0 - ccoeff) * PB[i];
					}
					yss = FUNCPT_EVAL(funcpt, PSS, N);

					if (yss <= ys) {
						ct = ihi * N;
						for(i = 0; i < N;++i) {
							P[ct + i] = PSS[i];
						}
						Y[ihi] = yss;

					} else {
						ct = ihi * N;
						for(i = 0; i < N;++i) {
							P[ct + i] = PS[i];
						}
						Y[ihi] = ys;

					}

				}


				if (L > 1) {
					ct = ihi * N;
					for(i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;

				}
			}

			if (Y[ihi] < ylo) {
				ylo = Y[ihi];
				ilo = ihi;
			}

			//To the end of the loop
			ysum = 0.0;
			for (j=0 ;j <= N;j++) {
				ysum += Y[j];
			}
			yavg = ysum/(N+1);
			s = 0.0;
			for (j=0;j<=N;j++) {
				s += pow((Y[j]-yavg),2.0);
			}
			s = sqrt(s);//Remove this statement if you want convergence in fewer iterations
			if (fabs(s) < reqmin) {
				ctl = 1;
			}

		}
		ct = ilo * N;
		for(i = 0; i < N;++i) {
			xmin[i] = P[ct + i];
		}
		ynl = Y[ilo];

		for (i = 0; i < N;++i) {
			del = dx[i] * dval;
			xmin[i] += del;
			fn = FUNCPT_EVAL(funcpt, xmin, N);
			if (fn < ynl) {
				ctl = 0;
				break;
			} else {
				ctl++;
			}
			xmin[i] = xmin[i] - 2 * del;
			fn = FUNCPT_EVAL(funcpt, xmin, N);
			if (fn < ynl) {
				ctl = 0;
				break;
			} else {
				ctl++;
			}
		}

		if (ctl == 0) {
			for (i = 0; i < N;++i) {
				xi[i] = xmin[i];
			}
			del = dval;
			s = 1.0;
		}

	}

	ct = N * N;
	for (i = 0; i < N;++i) {
		xf[i] = P[ct + i];
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	} else if (*niter < siter) {
		rcode = 1;
	}


	free(Y);
	free(P);
	free(PB);
	free(PS);
	free(PSS);
	free(PM);
	free(PL);
	free(xi);
	free(xmin);
	return rcode;
}